

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpConnection::closeNoWait(TcpConnection *this)

{
  bool bVar1;
  ConnectionStates logLevel;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  string *in_RDI;
  error_code ec;
  memory_order __m;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  error_code *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator<char> local_a9 [129];
  int local_28;
  error_code local_18;
  
  __m = seq_cst;
  CLI::std::atomic<bool>::store
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffedc,5),SUB81((ulong)in_RDI >> 0x38,0),
             (memory_order)in_RDI);
  logLevel = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::load
                       ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
                        ((long)&in_RDI[0x11].field_2 + 8),__m);
  if (logLevel == PRESTART) {
    bVar1 = concurrency::TriggerVariable::isActive((TriggerVariable *)0x7d10c1);
    if (bVar1) {
      concurrency::TriggerVariable::trigger((TriggerVariable *)CONCAT44(logLevel,__m));
    }
  }
  else if ((uint)(logLevel + 0xfffffffd) < 2) {
    concurrency::TriggerVariable::trigger((TriggerVariable *)CONCAT44(logLevel,__m));
  }
  CLI::std::error_code::error_code((error_code *)in_RDI);
  peVar4 = std::
           __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x7d1104);
  uVar2 = (*peVar4->_vptr_Socket[8])();
  if ((uVar2 & 1) == 0) {
    peVar4 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7d13cb);
    (*peVar4->_vptr_Socket[10])(peVar4,&local_18);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7d1124);
    local_28 = (*peVar4->_vptr_Socket[9])(peVar4,&local_18);
    bVar1 = std::error_code::operator_cast_to_bool(&local_18);
    if (bVar1) {
      iVar3 = CLI::std::error_code::value((error_code *)&local_18);
      if ((iVar3 != 0x6b) &&
         (iVar3 = CLI::std::error_code::value((error_code *)&local_18), iVar3 != 0x68)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff10,
                   (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (allocator<char> *)in_stack_ffffffffffffff00);
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffee8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(logLevel,__m),(char *)in_RDI);
        CLI::std::error_code::value((error_code *)&local_18);
        CLI::std::__cxx11::to_string(in_stack_ffffffffffffff0c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff00);
        logger((TcpConnection *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               logLevel,in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::allocator<char>::~allocator(local_a9);
      }
      std::error_code::clear((error_code *)in_RDI);
    }
    peVar4 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7d13a1);
    (*peVar4->_vptr_Socket[10])(peVar4,&local_18);
  }
  return;
}

Assistant:

void TcpConnection::closeNoWait()
{
    triggerhalt.store(true);
    switch (state.load()) {
        case ConnectionStates::PRESTART:
            if (receivingHalt.isActive()) {
                receivingHalt.trigger();
            }
            break;
        case ConnectionStates::HALTED:
        case ConnectionStates::CLOSED:
            receivingHalt.trigger();
            break;
        default:
            break;
    }

    std::error_code ec;
    if (socket_->is_open()) {
        socket_->shutdown(ec);
        if (ec) {
            if ((ec.value() != asio::error::not_connected) &&
                (ec.value() != asio::error::connection_reset)) {
                logger(
                    0,
                    std::string("error occurred sending shutdown::") +
                        ec.message() + " " + std::to_string(ec.value()));
            }
            ec.clear();
        }
        socket_->close(ec);
    } else {
        socket_->close(ec);
    }
}